

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3FindInIndex(Parse *pParse,Expr *pX,u32 inFlags,int *prRhsHasNull,int *aiMap)

{
  ushort uVar1;
  short sVar2;
  u32 uVar3;
  ExprList *pEVar4;
  SrcList *pSVar5;
  Table *pTab;
  Schema *pSVar6;
  i16 *piVar7;
  undefined1 auVar8 [16];
  u8 uVar9;
  char cVar10;
  int iVar11;
  uint uVar12;
  Vdbe *p;
  Expr *pEVar13;
  Expr *pLeft;
  CollSeq *pCVar14;
  byte bVar15;
  uint uVar16;
  int iVar17;
  Select *pSVar18;
  long lVar19;
  Schema **ppSVar20;
  sqlite3 *psVar21;
  Op *pOVar22;
  int iVar23;
  ExprList_item *pEVar24;
  ulong uVar25;
  Index *pIdx;
  ulong uVar26;
  ExprList_item *pEVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int local_bc;
  Walker local_60;
  
  iVar23 = pParse->nTab;
  pParse->nTab = iVar23 + 1;
  p = sqlite3GetVdbe(pParse);
  if (prRhsHasNull == (int *)0x0) {
    prRhsHasNull = (int *)0x0;
  }
  else if ((pX->flags & 0x800) != 0) {
    pEVar4 = ((pX->x).pSelect)->pEList;
    uVar16 = pEVar4->nExpr;
    if ((int)uVar16 < 1) {
      uVar12 = 0;
    }
    else {
      pEVar24 = pEVar4->a;
      uVar26 = 0;
      do {
        iVar11 = sqlite3ExprCanBeNull(pEVar24->pExpr);
        if (iVar11 != 0) goto LAB_0016a520;
        uVar26 = uVar26 + 1;
        pEVar24 = pEVar24 + 1;
      } while (uVar16 != uVar26);
      uVar26 = (ulong)uVar16;
LAB_0016a520:
      uVar12 = (uint)uVar26;
    }
    if (uVar12 == uVar16) {
      prRhsHasNull = (int *)0x0;
    }
  }
  if ((((((pParse->nErr == 0) && ((pX->flags & 0x820) == 0x800)) &&
        (pSVar18 = (pX->x).pSelect, pSVar18->pPrior == (Select *)0x0)) &&
       (((pSVar18->selFlags & 9) == 0 && (pSVar18->pLimit == (Expr *)0x0)))) &&
      ((pSVar18->pWhere == (Expr *)0x0 &&
       ((pSVar5 = pSVar18->pSrc, pSVar5->nSrc == 1 && (pSVar5->a[0].pSelect == (Select *)0x0))))))
     && (pTab = pSVar5->a[0].pTab, pTab->nModuleArg == 0)) {
    uVar16 = pSVar18->pEList->nExpr;
    uVar26 = (ulong)uVar16;
    pEVar24 = pSVar18->pEList->a;
    if (0 < (int)uVar16) {
      lVar19 = 0;
      do {
        if (**(char **)((long)&pEVar24->pExpr + lVar19) != -0x62) goto LAB_0016a5a0;
        lVar19 = lVar19 + 0x20;
      } while (uVar26 << 5 != lVar19);
    }
    if (pTab->pSchema == (Schema *)0x0) {
      iVar11 = -0x4240;
    }
    else {
      iVar11 = -0x10000;
      ppSVar20 = &pParse->db->aDb->pSchema;
      do {
        iVar11 = iVar11 + 0x10000;
        pSVar6 = *ppSVar20;
        ppSVar20 = ppSVar20 + 4;
      } while (pSVar6 != pTab->pSchema);
      iVar11 = iVar11 >> 0x10;
    }
    sqlite3CodeVerifySchema(pParse,iVar11);
    sqlite3TableLock(pParse,iVar11,pTab->tnum,'\0',pTab->zName);
    if (uVar16 != 1) {
      if (0 < (int)uVar16) goto LAB_0016a8fb;
LAB_0016a97e:
      pIdx = pTab->pIndex;
      if (pIdx != (Index *)0x0) {
        do {
          uVar1 = pIdx->nColumn;
          if (((uVar1 < 0x3f) && ((int)uVar16 <= (int)(uint)uVar1)) &&
             (((inFlags & 4) == 0 ||
              (((int)(uint)pIdx->nKeyCol <= (int)uVar16 &&
               ((uVar1 <= uVar16 || (pIdx->onError != '\0')))))))) {
            if ((int)uVar16 < 1) {
              uVar29 = 0;
            }
            else {
              uVar25 = 0;
              uVar29 = 0;
              do {
                pLeft = sqlite3VectorFieldSubexpr(pX->pLeft,(int)uVar25);
                pEVar13 = pEVar24[uVar25].pExpr;
                pCVar14 = sqlite3BinaryCompareCollSeq(pParse,pLeft,pEVar13);
                piVar7 = pIdx->aiColumn;
                sVar2 = pEVar13->iColumn;
                uVar30 = 0;
                while ((piVar7[uVar30] != sVar2 ||
                       ((pCVar14 != (CollSeq *)0x0 &&
                        (iVar28 = sqlite3StrICmp(pCVar14->zName,pIdx->azColl[uVar30]), iVar28 != 0))
                       ))) {
                  uVar30 = uVar30 + 1;
                  if (uVar26 == uVar30) goto LAB_0016aafc;
                }
                if ((uVar16 == (uint)uVar30) || ((uVar29 >> (uVar30 & 0x3f) & 1) != 0)) break;
                if (aiMap != (int *)0x0) {
                  aiMap[uVar25] = (uint)uVar30;
                }
                uVar29 = uVar29 | 1L << ((byte)uVar30 & 0x3f);
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar26);
            }
LAB_0016aafc:
            if ((uVar29 ^ -1L << ((byte)uVar16 & 0x3f)) == 0xffffffffffffffff) {
              local_bc = sqlite3VdbeAddOp3(p,0x11,0,0,0);
              sqlite3VdbeExplain(pParse,'\0',"USING INDEX %s FOR IN-OPERATOR",pIdx->zName);
              sqlite3VdbeAddOp3(p,0x6d,iVar23,pIdx->tnum,iVar11);
              sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
              bVar15 = *pIdx->aSortOrder;
              if (prRhsHasNull != (int *)0x0) {
                iVar11 = pParse->nMem + 1;
                pParse->nMem = iVar11;
                *prRhsHasNull = iVar11;
                if (uVar16 == 1) {
                  sqlite3SetHasNullFlag(p,iVar23,iVar11);
                }
              }
              iVar28 = bVar15 + 3;
              iVar11 = p->nOp;
              psVar21 = p->db;
              goto LAB_0016abbe;
            }
          }
          pIdx = pIdx->pNext;
        } while (pIdx != (Index *)0x0);
      }
      goto LAB_0016a5a0;
    }
    if (-1 < pEVar24->pExpr->iColumn) {
LAB_0016a8fb:
      uVar29 = 0;
      pEVar27 = pEVar24;
      do {
        pEVar13 = sqlite3VectorFieldSubexpr(pX->pLeft,(int)uVar29);
        lVar19 = (long)pEVar27->pExpr->iColumn;
        if (lVar19 < 0) {
          bVar15 = 0x44;
        }
        else {
          bVar15 = pTab->aCol[lVar19].affinity;
        }
        cVar10 = sqlite3CompareAffinity(pEVar13,bVar15);
        bVar31 = (byte)(cVar10 + 0xbfU) < 2;
        uVar29 = uVar29 + 1;
      } while ((uVar29 < uVar26) && (pEVar27 = pEVar27 + 1, 0x42 < bVar15 || bVar31));
      if (0x42 >= bVar15 && !bVar31) goto LAB_0016a5a0;
      goto LAB_0016a97e;
    }
    local_bc = sqlite3VdbeAddOp3(p,0x11,0,0,0);
    sqlite3OpenTable(pParse,iVar23,iVar11,pTab,0x6d);
    sqlite3VdbeExplain(pParse,'\0',"USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR",pTab->zName);
    iVar11 = p->nOp;
    psVar21 = p->db;
    iVar28 = 1;
LAB_0016abbe:
    if (psVar21->mallocFailed == '\0') {
      iVar17 = iVar11 + -1;
      if (-1 < local_bc) {
        iVar17 = local_bc;
      }
      pOVar22 = p->aOp + iVar17;
    }
    else {
      pOVar22 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar22->p2 = iVar11;
LAB_0016abf0:
    pX->iTable = iVar23;
  }
  else {
LAB_0016a5a0:
    if (((inFlags & 1) != 0) && ((pX->flags & 0x800) == 0)) {
      pEVar13 = pX->pLeft;
      pX->pLeft = (Expr *)0x0;
      local_60.eCode = '\x01';
      local_60.xExprCallback = exprNodeIsConstant;
      local_60.xSelectCallback = sqlite3SelectWalkFail;
      local_60.u.n = 0;
      walkExpr(&local_60,pX);
      pX->pLeft = pEVar13;
      iVar28 = 5;
      if ((local_60.eCode == '\0') || (((pX->x).pList)->nExpr < 3)) goto LAB_0016abf0;
    }
    uVar3 = pParse->nQueryLoop;
    if ((inFlags & 4) == 0) {
      iVar28 = 2;
      uVar16 = 0;
      if (prRhsHasNull == (int *)0x0) {
        iVar23 = 0;
      }
      else {
        iVar23 = pParse->nMem + 1;
        pParse->nMem = iVar23;
        *prRhsHasNull = iVar23;
        uVar16 = 0;
      }
    }
    else {
      pParse->nQueryLoop = 0;
      iVar28 = 2;
      iVar23 = 0;
      if (pX->pLeft->iColumn < 0) {
        uVar12 = pX->flags & 0x800;
        uVar16 = uVar12 >> 0xb ^ 1;
        iVar28 = 2 - (uint)(uVar12 == 0);
      }
      else {
        uVar16 = 0;
      }
    }
    sqlite3CodeSubselect(pParse,pX,iVar23,uVar16);
    pParse->nQueryLoop = uVar3;
  }
  auVar8 = _DAT_001940a0;
  if (aiMap == (int *)0x0) {
    return iVar28;
  }
  if (0xfffffffd < iVar28 - 5U) {
    return iVar28;
  }
  pEVar13 = pX->pLeft;
  uVar9 = pEVar13->op;
  if (uVar9 == 0xa4) {
    uVar9 = pEVar13->op2;
  }
  if (uVar9 == '\x7f') {
    pSVar18 = (pEVar13->x).pSelect;
  }
  else {
    uVar16 = 1;
    if (uVar9 != 0xa5) goto LAB_0016a6fb;
    pSVar18 = (Select *)&pEVar13->x;
  }
  uVar16 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar18->pEList)->pList->nExpr;
  if ((int)uVar16 < 1) {
    return iVar28;
  }
LAB_0016a6fb:
  lVar19 = (ulong)uVar16 - 1;
  auVar32._8_4_ = (int)lVar19;
  auVar32._0_8_ = lVar19;
  auVar32._12_4_ = (int)((ulong)lVar19 >> 0x20);
  uVar26 = 0;
  auVar32 = auVar32 ^ _DAT_001940a0;
  auVar33 = _DAT_00194090;
  do {
    auVar34 = auVar33 ^ auVar8;
    if ((bool)(~(auVar34._4_4_ == auVar32._4_4_ && auVar32._0_4_ < auVar34._0_4_ ||
                auVar32._4_4_ < auVar34._4_4_) & 1)) {
      aiMap[uVar26] = (int)uVar26;
    }
    if ((auVar34._12_4_ != auVar32._12_4_ || auVar34._8_4_ <= auVar32._8_4_) &&
        auVar34._12_4_ <= auVar32._12_4_) {
      aiMap[uVar26 + 1] = (int)uVar26 + 1;
    }
    uVar26 = uVar26 + 2;
    lVar19 = auVar33._8_8_;
    auVar33._0_8_ = auVar33._0_8_ + 2;
    auVar33._8_8_ = lVar19 + 2;
  } while ((uVar16 + 1 & 0xfffffffe) != uVar26);
  return iVar28;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindInIndex(
  Parse *pParse,             /* Parsing context */
  Expr *pX,                  /* The right-hand side (RHS) of the IN operator */
  u32 inFlags,               /* IN_INDEX_LOOP, _MEMBERSHIP, and/or _NOOP_OK */
  int *prRhsHasNull,         /* Register holding NULL status.  See notes */
  int *aiMap                 /* Mapping from Index fields to RHS fields */
){
  Select *p;                            /* SELECT to the right of IN operator */
  int eType = 0;                        /* Type of RHS table. IN_INDEX_* */
  int iTab = pParse->nTab++;            /* Cursor of the RHS table */
  int mustBeUnique;                     /* True if RHS must be unique */
  Vdbe *v = sqlite3GetVdbe(pParse);     /* Virtual machine being coded */

  assert( pX->op==TK_IN );
  mustBeUnique = (inFlags & IN_INDEX_LOOP)!=0;

  /* If the RHS of this IN(...) operator is a SELECT, and if it matters 
  ** whether or not the SELECT result contains NULL values, check whether
  ** or not NULL is actually possible (it may not be, for example, due 
  ** to NOT NULL constraints in the schema). If no NULL values are possible,
  ** set prRhsHasNull to 0 before continuing.  */
  if( prRhsHasNull && (pX->flags & EP_xIsSelect) ){
    int i;
    ExprList *pEList = pX->x.pSelect->pEList;
    for(i=0; i<pEList->nExpr; i++){
      if( sqlite3ExprCanBeNull(pEList->a[i].pExpr) ) break;
    }
    if( i==pEList->nExpr ){
      prRhsHasNull = 0;
    }
  }

  /* Check to see if an existing table or index can be used to
  ** satisfy the query.  This is preferable to generating a new 
  ** ephemeral table.  */
  if( pParse->nErr==0 && (p = isCandidateForInOpt(pX))!=0 ){
    sqlite3 *db = pParse->db;              /* Database connection */
    Table *pTab;                           /* Table <table>. */
    i16 iDb;                               /* Database idx for pTab */
    ExprList *pEList = p->pEList;
    int nExpr = pEList->nExpr;

    assert( p->pEList!=0 );             /* Because of isCandidateForInOpt(p) */
    assert( p->pEList->a[0].pExpr!=0 ); /* Because of isCandidateForInOpt(p) */
    assert( p->pSrc!=0 );               /* Because of isCandidateForInOpt(p) */
    pTab = p->pSrc->a[0].pTab;

    /* Code an OP_Transaction and OP_TableLock for <table>. */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    sqlite3CodeVerifySchema(pParse, iDb);
    sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);

    assert(v);  /* sqlite3GetVdbe() has always been previously called */
    if( nExpr==1 && pEList->a[0].pExpr->iColumn<0 ){
      /* The "x IN (SELECT rowid FROM table)" case */
      int iAddr = sqlite3VdbeAddOp0(v, OP_Once);
      VdbeCoverage(v);

      sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
      eType = IN_INDEX_ROWID;
      ExplainQueryPlan((pParse, 0,
            "USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR",pTab->zName));
      sqlite3VdbeJumpHere(v, iAddr);
    }else{
      Index *pIdx;                         /* Iterator variable */
      int affinity_ok = 1;
      int i;

      /* Check that the affinity that will be used to perform each 
      ** comparison is the same as the affinity of each column in table
      ** on the RHS of the IN operator.  If it not, it is not possible to
      ** use any index of the RHS table.  */
      for(i=0; i<nExpr && affinity_ok; i++){
        Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
        int iCol = pEList->a[i].pExpr->iColumn;
        char idxaff = sqlite3TableColumnAffinity(pTab,iCol); /* RHS table */
        char cmpaff = sqlite3CompareAffinity(pLhs, idxaff);
        testcase( cmpaff==SQLITE_AFF_BLOB );
        testcase( cmpaff==SQLITE_AFF_TEXT );
        switch( cmpaff ){
          case SQLITE_AFF_BLOB:
            break;
          case SQLITE_AFF_TEXT:
            /* sqlite3CompareAffinity() only returns TEXT if one side or the
            ** other has no affinity and the other side is TEXT.  Hence,
            ** the only way for cmpaff to be TEXT is for idxaff to be TEXT
            ** and for the term on the LHS of the IN to have no affinity. */
            assert( idxaff==SQLITE_AFF_TEXT );
            break;
          default:
            affinity_ok = sqlite3IsNumericAffinity(idxaff);
        }
      }

      if( affinity_ok ){
        /* Search for an existing index that will work for this IN operator */
        for(pIdx=pTab->pIndex; pIdx && eType==0; pIdx=pIdx->pNext){
          Bitmask colUsed;      /* Columns of the index used */
          Bitmask mCol;         /* Mask for the current column */
          if( pIdx->nColumn<nExpr ) continue;
          /* Maximum nColumn is BMS-2, not BMS-1, so that we can compute
          ** BITMASK(nExpr) without overflowing */
          testcase( pIdx->nColumn==BMS-2 );
          testcase( pIdx->nColumn==BMS-1 );
          if( pIdx->nColumn>=BMS-1 ) continue;
          if( mustBeUnique ){
            if( pIdx->nKeyCol>nExpr
             ||(pIdx->nColumn>nExpr && !IsUniqueIndex(pIdx))
            ){
              continue;  /* This index is not unique over the IN RHS columns */
            }
          }
  
          colUsed = 0;   /* Columns of index used so far */
          for(i=0; i<nExpr; i++){
            Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
            Expr *pRhs = pEList->a[i].pExpr;
            CollSeq *pReq = sqlite3BinaryCompareCollSeq(pParse, pLhs, pRhs);
            int j;
  
            assert( pReq!=0 || pRhs->iColumn==XN_ROWID || pParse->nErr );
            for(j=0; j<nExpr; j++){
              if( pIdx->aiColumn[j]!=pRhs->iColumn ) continue;
              assert( pIdx->azColl[j] );
              if( pReq!=0 && sqlite3StrICmp(pReq->zName, pIdx->azColl[j])!=0 ){
                continue;
              }
              break;
            }
            if( j==nExpr ) break;
            mCol = MASKBIT(j);
            if( mCol & colUsed ) break; /* Each column used only once */
            colUsed |= mCol;
            if( aiMap ) aiMap[i] = j;
          }
  
          assert( i==nExpr || colUsed!=(MASKBIT(nExpr)-1) );
          if( colUsed==(MASKBIT(nExpr)-1) ){
            /* If we reach this point, that means the index pIdx is usable */
            int iAddr = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
            ExplainQueryPlan((pParse, 0,
                              "USING INDEX %s FOR IN-OPERATOR",pIdx->zName));
            sqlite3VdbeAddOp3(v, OP_OpenRead, iTab, pIdx->tnum, iDb);
            sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
            VdbeComment((v, "%s", pIdx->zName));
            assert( IN_INDEX_INDEX_DESC == IN_INDEX_INDEX_ASC+1 );
            eType = IN_INDEX_INDEX_ASC + pIdx->aSortOrder[0];
  
            if( prRhsHasNull ){
#ifdef SQLITE_ENABLE_COLUMN_USED_MASK
              i64 mask = (1<<nExpr)-1;
              sqlite3VdbeAddOp4Dup8(v, OP_ColumnsUsed, 
                  iTab, 0, 0, (u8*)&mask, P4_INT64);
#endif
              *prRhsHasNull = ++pParse->nMem;
              if( nExpr==1 ){
                sqlite3SetHasNullFlag(v, iTab, *prRhsHasNull);
              }
            }
            sqlite3VdbeJumpHere(v, iAddr);
          }
        } /* End loop over indexes */
      } /* End if( affinity_ok ) */
    } /* End if not an rowid index */
  } /* End attempt to optimize using an index */

  /* If no preexisting index is available for the IN clause
  ** and IN_INDEX_NOOP is an allowed reply
  ** and the RHS of the IN operator is a list, not a subquery
  ** and the RHS is not constant or has two or fewer terms,
  ** then it is not worth creating an ephemeral table to evaluate
  ** the IN operator so return IN_INDEX_NOOP.
  */
  if( eType==0
   && (inFlags & IN_INDEX_NOOP_OK)
   && !ExprHasProperty(pX, EP_xIsSelect)
   && (!sqlite3InRhsIsConstant(pX) || pX->x.pList->nExpr<=2)
  ){
    eType = IN_INDEX_NOOP;
  }

  if( eType==0 ){
    /* Could not find an existing table or index to use as the RHS b-tree.
    ** We will have to generate an ephemeral table to do the job.
    */
    u32 savedNQueryLoop = pParse->nQueryLoop;
    int rMayHaveNull = 0;
    eType = IN_INDEX_EPH;
    if( inFlags & IN_INDEX_LOOP ){
      pParse->nQueryLoop = 0;
      if( pX->pLeft->iColumn<0 && !ExprHasProperty(pX, EP_xIsSelect) ){
        eType = IN_INDEX_ROWID;
      }
    }else if( prRhsHasNull ){
      *prRhsHasNull = rMayHaveNull = ++pParse->nMem;
    }
    sqlite3CodeSubselect(pParse, pX, rMayHaveNull, eType==IN_INDEX_ROWID);
    pParse->nQueryLoop = savedNQueryLoop;
  }else{
    pX->iTable = iTab;
  }

  if( aiMap && eType!=IN_INDEX_INDEX_ASC && eType!=IN_INDEX_INDEX_DESC ){
    int i, n;
    n = sqlite3ExprVectorSize(pX->pLeft);
    for(i=0; i<n; i++) aiMap[i] = i;
  }
  return eType;
}